

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O3

bool __thiscall spvtools::opt::SSAPropagator::Simulate(SSAPropagator *this,Instruction *instr)

{
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *this_00;
  Edge *pEVar1;
  IRContext *this_01;
  pointer pOVar2;
  uint **ppuVar3;
  bool bVar4;
  char cVar5;
  PropStatus status;
  uint32_t id;
  const_iterator cVar6;
  iterator iVar7;
  BasicBlock *b1;
  Instruction *pIVar8;
  uint uVar9;
  uint **ppuVar10;
  Edge *e;
  Edge *edge;
  uint32_t index;
  Operand *operand;
  pointer pOVar11;
  __hashtable *__h;
  bool bVar12;
  __node_gen_type __node_gen;
  BasicBlock *dest_bb;
  Instruction *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  BasicBlock *local_38;
  
  this_00 = &this->do_not_simulate_;
  local_58._M_unused._M_object = instr;
  cVar6 = std::
          _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&this_00->_M_h,(key_type *)&local_58);
  if (cVar6.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur ==
      (__node_type *)0x0) {
    local_60 = (Instruction *)&stack0xffffffffffffffc8;
    local_38 = (BasicBlock *)0x0;
    local_58._M_unused._M_object = instr;
    if ((this->visit_fn_).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_002617da:
      std::__throw_bad_function_call();
    }
    status = (*(this->visit_fn_)._M_invoker)
                       ((_Any_data *)&this->visit_fn_,(Instruction **)&local_58,
                        (BasicBlock ***)&local_60);
    bVar4 = SetStatus(this,instr,status);
    if (status != kVarying) {
      bVar12 = status == kInteresting;
      if (bVar12) {
        if (bVar4) {
          AddSSAEdges(this,instr);
        }
        if (local_38 != (BasicBlock *)0x0) {
          b1 = IRContext::get_instr_block(this->ctx_,instr);
          Edge::Edge((Edge *)&local_58,b1,local_38);
          AddControlEdge(this,(Edge *)&local_58);
        }
      }
      if (instr->opcode_ == OpPhi) {
        uVar9 = (int)((ulong)((long)(instr->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(instr->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555;
        if (2 < uVar9) {
          index = 2;
          do {
            if (uVar9 - 1 <= index) {
              __assert_fail("i % 2 == 0 && i < instr->NumOperands() - 1 && \"malformed Phi arguments\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/propagator.cpp"
                            ,0x91,"bool spvtools::opt::SSAPropagator::Simulate(Instruction *)");
            }
            id = Instruction::GetSingleWordOperand(instr,index);
            this_01 = this->ctx_;
            if ((this_01->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
              IRContext::BuildDefUseManager(this_01);
            }
            pIVar8 = analysis::DefUseManager::GetDef
                               ((this_01->def_use_mgr_)._M_t.
                                super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                .
                                super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                                ._M_head_impl,id);
            bVar4 = IsPhiArgExecutable(this,instr,index);
            if (!bVar4) {
              return bVar12;
            }
            local_58._M_unused._M_object = pIVar8;
            cVar6 = std::
                    _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::find(&this_00->_M_h,(key_type *)&local_58);
            if (cVar6.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur ==
                (__node_type *)0x0) {
              return bVar12;
            }
            index = index + 2;
            uVar9 = (int)((ulong)((long)(instr->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(instr->operands_).
                                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                    -0x55555555;
          } while (index < uVar9);
          if (cVar6.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur ==
              (__node_type *)0x0) {
            return bVar12;
          }
        }
      }
      else {
        local_58._8_8_ = 0;
        local_40 = std::
                   _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/propagator.cpp:159:31)>
                   ::_M_invoke;
        local_48 = std::
                   _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/propagator.cpp:159:31)>
                   ::_M_manager;
        pOVar11 = (instr->operands_).
                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pOVar2 = (instr->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_58._M_unused._M_object = this;
        if (pOVar11 == pOVar2) {
          std::
          _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/propagator.cpp:159:31)>
          ::_M_manager(&local_58,&local_58,__destroy_functor);
        }
        else {
          do {
            bVar4 = spvIsInIdType(pOVar11->type);
            if (bVar4) {
              ppuVar3 = (uint **)(pOVar11->words).large_data_._M_t.
                                 super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                 ._M_head_impl;
              ppuVar10 = &(pOVar11->words).small_data_;
              if (ppuVar3 != (uint **)0x0) {
                ppuVar10 = ppuVar3;
              }
              local_60 = (Instruction *)*ppuVar10;
              if (local_48 == (code *)0x0) goto LAB_002617da;
              cVar5 = (*local_40)(&local_58,&local_60);
              if (cVar5 == '\0') {
                bVar4 = true;
                goto LAB_0026179b;
              }
            }
            pOVar11 = pOVar11 + 1;
          } while (pOVar11 != pOVar2);
          bVar4 = false;
LAB_0026179b:
          if (local_48 != (code *)0x0) {
            (*local_48)(&local_58,&local_58,3);
          }
          if (bVar4) {
            return bVar12;
          }
        }
      }
      local_60 = instr;
      local_58._M_unused._0_8_ = (undefined8)this_00;
      std::
      _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)this_00);
      return bVar12;
    }
    local_60 = instr;
    local_58._M_unused._0_8_ = (undefined8)this_00;
    std::
    _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
              ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)this_00);
    if (bVar4) {
      AddSSAEdges(this,instr);
    }
    bVar4 = spvOpcodeIsBlockTerminator(instr->opcode_);
    if (bVar4) {
      local_58._M_unused._M_object = IRContext::get_instr_block(this->ctx_,instr);
      iVar7 = std::
              _Hashtable<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->bb_succs_)._M_h,(key_type *)&local_58);
      if (iVar7.
          super__Node_iterator_base<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
      }
      pEVar1 = *(Edge **)((long)iVar7.
                                super__Node_iterator_base<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_false>
                                ._M_cur + 0x18);
      for (edge = *(Edge **)((long)iVar7.
                                   super__Node_iterator_base<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_false>
                                   ._M_cur + 0x10); edge != pEVar1; edge = edge + 1) {
        AddControlEdge(this,edge);
      }
    }
  }
  return false;
}

Assistant:

bool SSAPropagator::Simulate(Instruction* instr) {
  bool changed = false;

  // Don't bother visiting instructions that should not be simulated again.
  if (!ShouldSimulateAgain(instr)) {
    return changed;
  }

  BasicBlock* dest_bb = nullptr;
  PropStatus status = visit_fn_(instr, &dest_bb);
  bool status_changed = SetStatus(instr, status);

  if (status == kVarying) {
    // The statement produces a varying result, add it to the list of statements
    // not to simulate anymore and add its SSA def-use edges for simulation.
    DontSimulateAgain(instr);
    if (status_changed) {
      AddSSAEdges(instr);
    }

    // If |instr| is a block terminator, add all the control edges out of its
    // block.
    if (instr->IsBlockTerminator()) {
      BasicBlock* block = ctx_->get_instr_block(instr);
      for (const auto& e : bb_succs_.at(block)) {
        AddControlEdge(e);
      }
    }
    return false;
  } else if (status == kInteresting) {
    // Add the SSA edges coming out of this instruction if the propagation
    // status has changed.
    if (status_changed) {
      AddSSAEdges(instr);
    }

    // If there are multiple outgoing control flow edges and we know which one
    // will be taken, add the destination block to the CFG work list.
    if (dest_bb) {
      AddControlEdge(Edge(ctx_->get_instr_block(instr), dest_bb));
    }
    changed = true;
  }

  // At this point, we are dealing with instructions that are in status
  // kInteresting or kNotInteresting.  To decide whether this instruction should
  // be simulated again, we examine its operands.  If at least one operand O is
  // defined at an instruction D that should be simulated again, then the output
  // of D might affect |instr|, so we should simulate |instr| again.
  bool has_operands_to_simulate = false;
  if (instr->opcode() == spv::Op::OpPhi) {
    // For Phi instructions, an operand causes the Phi to be simulated again if
    // the operand comes from an edge that has not yet been traversed or if its
    // definition should be simulated again.
    for (uint32_t i = 2; i < instr->NumOperands(); i += 2) {
      // Phi arguments come in pairs. Index 'i' contains the
      // variable id, index 'i + 1' is the originating block id.
      assert(i % 2 == 0 && i < instr->NumOperands() - 1 &&
             "malformed Phi arguments");

      uint32_t arg_id = instr->GetSingleWordOperand(i);
      Instruction* arg_def_instr = get_def_use_mgr()->GetDef(arg_id);
      if (!IsPhiArgExecutable(instr, i) || ShouldSimulateAgain(arg_def_instr)) {
        has_operands_to_simulate = true;
        break;
      }
    }
  } else {
    // For regular instructions, check if the defining instruction of each
    // operand needs to be simulated again.  If so, then this instruction should
    // also be simulated again.
    has_operands_to_simulate =
        !instr->WhileEachInId([this](const uint32_t* use) {
          Instruction* def_instr = get_def_use_mgr()->GetDef(*use);
          if (ShouldSimulateAgain(def_instr)) {
            return false;
          }
          return true;
        });
  }

  if (!has_operands_to_simulate) {
    DontSimulateAgain(instr);
  }

  return changed;
}